

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O1

void __thiscall wasm::Analyzer::scanChildren(Analyzer *this,Expression *curr)

{
  iterator __position;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  Index IVar4;
  HeapType HVar5;
  const_iterator cVar6;
  vector<wasm::Expression*,std::allocator<wasm::Expression*>> *this_00;
  _Rb_tree_color *p_Var7;
  ulong uVar8;
  Index IVar9;
  Index index;
  undefined1 local_1d0 [24];
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_1b8;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_188;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_158;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_128;
  bool local_f0;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_d0;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_a0;
  _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_70;
  vector<wasm::Expression*,std::allocator<wasm::Expression*>> *local_68;
  uintptr_t local_60;
  _Map_base<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<const_std::pair<wasm::HeapType,_unsigned_int>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_std::pair<wasm::HeapType,_unsigned_int>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_58;
  undefined1 local_50 [8];
  StructField structField;
  Module *local_38;
  Expression *operand;
  
  structField._8_8_ = this;
  if (((this->options->closedWorld == true) && ((curr->type).id != 1)) && (curr->_id == StructNewId)
     ) {
    HVar5 = wasm::Type::getHeapType(&curr->type);
    if (curr[1].type.id != 0) {
      local_70 = (_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)(structField._8_8_ + 0x120);
      local_58 = (_Map_base<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<const_std::pair<wasm::HeapType,_unsigned_int>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_std::pair<wasm::HeapType,_unsigned_int>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)(structField._8_8_ + 0x158);
      local_68 = (vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                 (structField._8_8_ + 0x98);
      uVar8 = 0;
      local_60 = HVar5.id;
      do {
        local_38 = *(Module **)(*(long *)(curr + 1) + uVar8 * 8);
        local_50 = (undefined1  [8])HVar5.id;
        structField.first.id._0_4_ = (int)uVar8;
        cVar6 = std::
                _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(local_70,(key_type *)local_50);
        if (cVar6.super__Node_iterator_base<std::pair<wasm::HeapType,_unsigned_int>,_true>._M_cur ==
            (__node_type *)0x0) {
          EffectAnalyzer::EffectAnalyzer
                    ((EffectAnalyzer *)local_1d0,*(PassOptions **)(structField._8_8_ + 8),
                     *(Module **)structField._8_8_,(Expression *)local_38);
          if (local_f0 != false) {
            std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::~_Rb_tree(&local_a0);
            std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::~_Rb_tree(&local_d0);
            std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::~_Rb_tree(&local_128);
            std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::~_Rb_tree(&local_158);
            std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~_Rb_tree(&local_188);
            std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~_Rb_tree(&local_1b8);
            goto LAB_00aab8e9;
          }
          bVar3 = EffectAnalyzer::hasNonTrapSideEffects((EffectAnalyzer *)local_1d0);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree(&local_a0);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree(&local_d0);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree(&local_128);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree(&local_158);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&local_188);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&local_1b8);
          if (bVar3) goto LAB_00aab8e9;
          FindAll<wasm::Call>::FindAll((FindAll<wasm::Call> *)local_1d0,(Expression *)local_38);
          uVar2 = local_1d0._8_8_;
          uVar1 = local_1d0._0_8_;
          if ((Module *)local_1d0._0_8_ != (Module *)0x0) {
            operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ - local_1d0._0_8_);
          }
          HVar5.id = local_60;
          if (uVar1 != uVar2) goto LAB_00aab8e9;
          this_00 = (vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                    std::__detail::
                    _Map_base<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<const_std::pair<wasm::HeapType,_unsigned_int>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_std::pair<wasm::HeapType,_unsigned_int>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_58,(key_type *)local_50);
          __position._M_current = *(Expression ***)(this_00 + 8);
          if (__position._M_current == *(Expression ***)(this_00 + 0x10)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>(this_00,__position,(Expression **)&local_38);
          }
          else {
            *__position._M_current = (Expression *)local_38;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
          addReferences((Analyzer *)structField._8_8_,(Expression *)local_38);
        }
        else {
LAB_00aab8e9:
          local_1d0._0_8_ = local_38;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*&>(local_68,(Expression **)local_1d0);
        }
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (uVar8 < curr[1].type.id);
    }
  }
  else {
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
              ((AbstractChildIterator<wasm::ChildIterator> *)local_1d0,curr);
    IVar9 = (int)((ulong)((long)local_1b8._M_impl.super__Rb_tree_header._M_header._M_left -
                         (long)local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent) >> 3) +
            local_1d0._0_4_;
    if (IVar9 != 0) {
      structField._8_8_ = structField._8_8_ + 0x98;
      index = 0;
      do {
        IVar4 = AbstractChildIterator<wasm::ChildIterator>::mapIndex
                          ((AbstractChildIterator<wasm::ChildIterator> *)local_1d0,index);
        p_Var7 = &local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent[-1]._M_color +
                 (ulong)IVar4 * 2;
        if (IVar4 < 4) {
          p_Var7 = (_Rb_tree_color *)(local_1d0 + (ulong)IVar4 * 8 + 8);
        }
        local_50 = (undefined1  [8])**(uintptr_t **)p_Var7;
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*&>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)structField._8_8_,
                   (Expression **)local_50);
        index = index + 1;
      } while (IVar9 != index);
    }
    if (local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      operator_delete(local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent,
                      (long)local_1b8._M_impl.super__Rb_tree_header._M_header._M_right -
                      (long)local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent);
    }
  }
  return;
}

Assistant:

void scanChildren(Expression* curr) {
    // For now, the only special handling we have is fields of struct.new, which
    // we defer walking of to when we know there is a read that can actually
    // read them, see comments above on |expressionQueue|. We can only do that
    // optimization in closed world (as otherwise the field might be read
    // outside of the code we can see), and when it is reached (if it's
    // unreachable then we don't know the type, and can defer that to DCE to
    // remove).
    if (!options.closedWorld || curr->type == Type::unreachable ||
        !curr->is<StructNew>()) {
      for (auto* child : ChildIterator(curr)) {
        use(child);
      }
      return;
    }

    auto* new_ = curr->cast<StructNew>();
    auto type = new_->type.getHeapType();

    for (Index i = 0; i < new_->operands.size(); i++) {
      auto* operand = new_->operands[i];
      auto structField = StructField{type, i};

      // If this struct field has already been read, then we should use the
      // contents there now.
      auto useOperandNow = readStructFields.count(structField);

      // Side effects are tricky to reason about - the side effects must happen
      // even if we never read the struct field - so give up and consider it
      // used.
      if (!useOperandNow) {
        useOperandNow =
          EffectAnalyzer(options, *module, operand).hasSideEffects();
      }

      // We must handle the call.without.effects intrinsic here in a special
      // manner. That intrinsic is reported as having no side effects in
      // EffectAnalyzer, but even though for optimization purposes we can ignore
      // effects, the called code *is* actually reached, and it might have side
      // effects. In other words, the point of the intrinsic is to temporarily
      // ignore those effects during one phase of optimization. Or, put another
      // way, the intrinsic lets us ignore the effects of computing some value,
      // but we do still need to compute that value if it is received and used
      // (if it is not received and used, other passes will remove it).
      if (!useOperandNow) {
        // To detect this, look for any call. A non-intrinsic call would have
        // already been detected when we looked for side effects, so this will
        // only notice intrinsic calls.
        useOperandNow = !FindAll<Call>(operand).list.empty();
      }

      if (useOperandNow) {
        use(operand);
      } else {
        // This data does not need to be read now, but might be read later. Note
        // it as unread.
        unreadStructFieldExprMap[structField].push_back(operand);

        // We also must note that anything in this operand is referenced, even
        // if it never ends up used, so the IR remains valid.
        addReferences(operand);
      }
    }
  }